

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::LRN_x86_avx::forward_inplace(LRN_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint _c;
  size_t sVar2;
  _func_int **pp_Var3;
  void *pvVar4;
  size_t sVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  int *piVar12;
  void *pvVar13;
  pointer piVar14;
  bool bVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  Mat *pMVar19;
  ulong uVar20;
  int iVar21;
  float *pfVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  undefined1 (*pauVar28) [32];
  long lVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  void *pvVar33;
  Mat *pMVar34;
  ulong uVar35;
  float fVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  float fVar41;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  allocator_type local_1e9;
  Mat *local_1e8;
  Mat *local_1e0;
  Mat square_sum;
  Mat *local_188;
  Mat square_blob;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar16 = bottom_top_blob->w;
  local_1e8 = (Mat *)(ulong)(uint)bottom_top_blob->h;
  _c = bottom_top_blob->c;
  pMVar34 = (Mat *)(ulong)_c;
  sVar2 = bottom_top_blob->elemsize;
  square_blob.cstep = 0;
  square_blob.data = (Allocator *)0x0;
  square_blob.refcount._0_4_ = 0;
  square_blob.refcount._4_4_ = 0;
  square_blob.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  square_blob.elempack = 0;
  square_blob.allocator = (Allocator *)square_blob.data;
  square_blob.dims = (int)square_blob.refcount;
  square_blob.w = square_blob.refcount._4_4_;
  square_blob._48_8_ = square_blob.elemsize;
  square_blob.c = square_blob.elempack;
  Mat::create(&square_blob,uVar16,bottom_top_blob->h,_c,sVar2,opt->workspace_allocator);
  iVar17 = -100;
  if ((square_blob.data == (void *)0x0) || ((long)square_blob.c * square_blob.cstep == 0))
  goto LAB_001ec0f3;
  uVar25 = (int)local_1e8 * uVar16;
  if (0 < (int)_c) {
    pMVar19 = (Mat *)0x0;
    do {
      pfVar22 = (float *)(bottom_top_blob->cstep * (long)pMVar19 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      pauVar28 = (undefined1 (*) [32])
                 (square_blob.cstep * (long)pMVar19 * square_blob.elemsize + (long)square_blob.data)
      ;
      if ((int)uVar25 < 8) {
        uVar26 = 0;
      }
      else {
        iVar30 = 7;
        do {
          auVar7._4_4_ = pfVar22[1] * pfVar22[1];
          auVar7._0_4_ = *pfVar22 * *pfVar22;
          auVar7._8_4_ = pfVar22[2] * pfVar22[2];
          auVar7._12_4_ = pfVar22[3] * pfVar22[3];
          auVar7._16_4_ = pfVar22[4] * pfVar22[4];
          auVar7._20_4_ = pfVar22[5] * pfVar22[5];
          auVar7._24_4_ = pfVar22[6] * pfVar22[6];
          auVar7._28_4_ = pfVar22[7];
          *pauVar28 = auVar7;
          pfVar22 = pfVar22 + 8;
          pauVar28 = pauVar28 + 1;
          iVar30 = iVar30 + 8;
          uVar26 = uVar25 & 0xfffffff8;
        } while (iVar30 < (int)uVar25);
      }
      if (uVar25 - uVar26 != 0 && (int)uVar26 <= (int)uVar25) {
        lVar32 = 0;
        do {
          *(float *)(*pauVar28 + lVar32 * 4) = pfVar22[lVar32] * pfVar22[lVar32];
          lVar32 = lVar32 + 1;
        } while (uVar25 - uVar26 != (int)lVar32);
      }
      pMVar19 = (Mat *)((long)&pMVar19->data + 1);
    } while (pMVar19 != pMVar34);
  }
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86_avx[-3]) == 0) {
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.allocator = (Allocator *)0x0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
    Mat::create(&square_sum,uVar16,(int)local_1e8,_c,sVar2,opt->workspace_allocator);
    bVar15 = square_sum.data == (void *)0x0 || (long)square_sum.c * square_sum.cstep == 0;
    if (bVar15) {
      piVar12 = (int *)CONCAT44(square_sum.refcount._4_4_,(int)square_sum.refcount);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (square_sum.allocator == (Allocator *)0x0) {
            if (square_sum.data != (void *)0x0) {
              free(square_sum.data);
            }
          }
          else {
            (**(code **)(*(long *)square_sum.allocator + 0x18))();
          }
        }
      }
      goto LAB_001ec0f3;
    }
    local_1e8 = bottom_top_blob;
    if (0 < square_sum.c * (int)square_sum.cstep) {
      memset(square_sum.data,0,(ulong)(uint)(square_sum.c * (int)square_sum.cstep) << 2);
    }
    if (0 < (int)_c) {
      fVar58 = *(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_avx[-3]) /
               (float)*(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3]);
      pp_Var3 = this->_vptr_LRN_x86_avx;
      auVar10 = vshufps_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),0);
      pMVar19 = (Mat *)0x0;
      do {
        auVar60._8_4_ = 0x3f000000;
        auVar60._0_8_ = 0x3f0000003f000000;
        auVar60._12_4_ = 0x3f000000;
        auVar60._16_4_ = 0x3f000000;
        auVar60._20_4_ = 0x3f000000;
        auVar60._24_4_ = 0x3f000000;
        auVar60._28_4_ = 0x3f000000;
        iVar17 = *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]) / 2;
        iVar30 = (int)pMVar19;
        uVar16 = iVar30 - iVar17;
        if ((int)uVar16 <= iVar17 + iVar30) {
          do {
            if (uVar16 < _c) {
              pfVar22 = (float *)(uVar16 * square_blob.cstep * square_blob.elemsize +
                                 (long)square_blob.data);
              pauVar28 = (undefined1 (*) [32])
                         (square_sum.cstep * (long)pMVar19 *
                          CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize) +
                         (long)square_sum.data);
              uVar26 = 0;
              if (7 < (int)uVar25) {
                iVar17 = 7;
                do {
                  auVar37._0_4_ = *(float *)*pauVar28 + *pfVar22;
                  auVar37._4_4_ = *(float *)(*pauVar28 + 4) + pfVar22[1];
                  auVar37._8_4_ = *(float *)(*pauVar28 + 8) + pfVar22[2];
                  auVar37._12_4_ = *(float *)(*pauVar28 + 0xc) + pfVar22[3];
                  auVar37._16_4_ = *(float *)(*pauVar28 + 0x10) + pfVar22[4];
                  auVar37._20_4_ = *(float *)(*pauVar28 + 0x14) + pfVar22[5];
                  auVar37._24_4_ = *(float *)(*pauVar28 + 0x18) + pfVar22[6];
                  auVar37._28_4_ = *(float *)(*pauVar28 + 0x1c) + pfVar22[7];
                  *pauVar28 = auVar37;
                  pfVar22 = pfVar22 + 8;
                  pauVar28 = pauVar28 + 1;
                  iVar17 = iVar17 + 8;
                  uVar26 = uVar25 & 0xfffffff8;
                } while (iVar17 < (int)uVar25);
              }
              if (uVar25 - uVar26 != 0 && (int)uVar26 <= (int)uVar25) {
                lVar32 = 0;
                do {
                  *(float *)(*pauVar28 + lVar32 * 4) =
                       *(float *)(*pauVar28 + lVar32 * 4) + pfVar22[lVar32];
                  lVar32 = lVar32 + 1;
                } while (uVar25 - uVar26 != (int)lVar32);
              }
            }
            bVar6 = (int)uVar16 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]) / 2 + iVar30;
            uVar16 = uVar16 + 1;
          } while (bVar6);
        }
        pauVar28 = (undefined1 (*) [32])
                   (local_1e8->cstep * (long)pMVar19 * local_1e8->elemsize + (long)local_1e8->data);
        pfVar22 = (float *)(square_sum.cstep * (long)pMVar19 *
                            CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize) +
                           (long)square_sum.data);
        uVar16 = 0;
        if (7 < (int)uVar25) {
          fVar36 = *(float *)(&this->field_0xe0 + (long)pp_Var3[-3]);
          fVar1 = *(float *)(&this->field_0xdc + (long)pp_Var3[-3]);
          uVar35 = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
          iVar17 = 7;
          auVar61._8_4_ = 0xc2b0c0a5;
          auVar61._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar61._12_4_ = 0xc2b0c0a5;
          auVar61._16_4_ = 0xc2b0c0a5;
          auVar61._20_4_ = 0xc2b0c0a5;
          auVar61._24_4_ = 0xc2b0c0a5;
          auVar61._28_4_ = 0xc2b0c0a5;
          auVar38._8_4_ = 0x3f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar38._12_4_ = 0x3f800000;
          auVar38._16_4_ = 0x3f800000;
          auVar38._20_4_ = 0x3f800000;
          auVar38._24_4_ = 0x3f800000;
          auVar38._28_4_ = 0x3f800000;
          auVar39._8_4_ = 0xffffff81;
          auVar39._0_8_ = 0xffffff81ffffff81;
          auVar39._12_4_ = 0xffffff81;
          auVar59._8_4_ = 0x3f800000;
          auVar59._0_8_ = 0x3f8000003f800000;
          auVar59._12_4_ = 0x3f800000;
          do {
            local_b8 = auVar10._0_4_;
            fStack_b4 = auVar10._4_4_;
            fStack_b0 = auVar10._8_4_;
            fStack_ac = auVar10._12_4_;
            auVar40._0_4_ = local_b8 * *pfVar22 + fVar36;
            auVar40._4_4_ = fStack_b4 * pfVar22[1] + fVar36;
            auVar40._8_4_ = fStack_b0 * pfVar22[2] + fVar36;
            auVar40._12_4_ = fStack_ac * pfVar22[3] + fVar36;
            auVar40._16_4_ = local_b8 * pfVar22[4] + fVar36;
            auVar40._20_4_ = fStack_b4 * pfVar22[5] + fVar36;
            auVar40._24_4_ = fStack_b0 * pfVar22[6] + fVar36;
            auVar40._28_4_ = fStack_ac + fVar36;
            auVar42._8_4_ = 0x800000;
            auVar42._0_8_ = 0x80000000800000;
            auVar42._12_4_ = 0x800000;
            auVar42._16_4_ = 0x800000;
            auVar42._20_4_ = 0x800000;
            auVar42._24_4_ = 0x800000;
            auVar42._28_4_ = 0x800000;
            auVar8 = vmaxps_avx(auVar40,auVar42);
            auVar55._8_4_ = 0x807fffff;
            auVar55._0_8_ = 0x807fffff807fffff;
            auVar55._12_4_ = 0x807fffff;
            auVar55._16_4_ = 0x807fffff;
            auVar55._20_4_ = 0x807fffff;
            auVar55._24_4_ = 0x807fffff;
            auVar55._28_4_ = 0x807fffff;
            auVar7 = vandps_avx(auVar8,auVar55);
            auVar9 = vorps_avx(auVar60,auVar7);
            auVar56._8_4_ = 0x3f3504f3;
            auVar56._0_8_ = 0x3f3504f33f3504f3;
            auVar56._12_4_ = 0x3f3504f3;
            auVar56._16_4_ = 0x3f3504f3;
            auVar56._20_4_ = 0x3f3504f3;
            auVar56._24_4_ = 0x3f3504f3;
            auVar56._28_4_ = 0x3f3504f3;
            auVar37 = vcmpps_avx(auVar56,auVar9,2);
            auVar57 = vpsrld_avx(auVar8._16_16_,0x17);
            auVar7 = vandnps_avx(auVar37,auVar9);
            fVar41 = auVar9._0_4_ + -1.0 + auVar7._0_4_;
            fVar47 = auVar9._4_4_ + -1.0 + auVar7._4_4_;
            fVar48 = auVar9._8_4_ + -1.0 + auVar7._8_4_;
            fVar49 = auVar9._12_4_ + -1.0 + auVar7._12_4_;
            fVar50 = auVar9._16_4_ + -1.0 + auVar7._16_4_;
            fVar51 = auVar9._20_4_ + -1.0 + auVar7._20_4_;
            fVar52 = auVar9._24_4_ + -1.0 + auVar7._24_4_;
            auVar54 = vpsubd_avx(auVar57,auVar37._16_16_);
            auVar57 = vpsrld_avx(auVar8._0_16_,0x17);
            auVar57 = vpsubd_avx(auVar57,auVar37._0_16_);
            auVar57 = vpaddd_avx(auVar57,auVar39);
            auVar54 = vpaddd_avx(auVar54,auVar39);
            auVar53._16_16_ = auVar54;
            auVar53._0_16_ = auVar57;
            auVar8 = vcvtdq2ps_avx(auVar53);
            auVar37 = vcmpps_avx(auVar40,_DAT_0030dda0,2);
            auVar43._0_4_ =
                 auVar8._0_4_ * 0.6931472 + fVar41 +
                 fVar41 * fVar41 *
                 (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                       -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 +
                    0.20000714) * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5);
            auVar43._4_4_ =
                 auVar8._4_4_ * 0.6931472 + fVar47 +
                 fVar47 * fVar47 *
                 (((((((((fVar47 * 0.070376836 + -0.1151461) * fVar47 + 0.116769984) * fVar47 +
                       -0.12420141) * fVar47 + 0.14249323) * fVar47 + -0.16668057) * fVar47 +
                    0.20000714) * fVar47 + -0.24999994) * fVar47 + 0.3333333) * fVar47 + -0.5);
            auVar43._8_4_ =
                 auVar8._8_4_ * 0.6931472 + fVar48 +
                 fVar48 * fVar48 *
                 (((((((((fVar48 * 0.070376836 + -0.1151461) * fVar48 + 0.116769984) * fVar48 +
                       -0.12420141) * fVar48 + 0.14249323) * fVar48 + -0.16668057) * fVar48 +
                    0.20000714) * fVar48 + -0.24999994) * fVar48 + 0.3333333) * fVar48 + -0.5);
            auVar43._12_4_ =
                 auVar8._12_4_ * 0.6931472 + fVar49 +
                 fVar49 * fVar49 *
                 (((((((((fVar49 * 0.070376836 + -0.1151461) * fVar49 + 0.116769984) * fVar49 +
                       -0.12420141) * fVar49 + 0.14249323) * fVar49 + -0.16668057) * fVar49 +
                    0.20000714) * fVar49 + -0.24999994) * fVar49 + 0.3333333) * fVar49 + -0.5);
            auVar43._16_4_ =
                 auVar8._16_4_ * 0.6931472 + fVar50 +
                 fVar50 * fVar50 *
                 (((((((((fVar50 * 0.070376836 + -0.1151461) * fVar50 + 0.116769984) * fVar50 +
                       -0.12420141) * fVar50 + 0.14249323) * fVar50 + -0.16668057) * fVar50 +
                    0.20000714) * fVar50 + -0.24999994) * fVar50 + 0.3333333) * fVar50 + -0.5);
            auVar43._20_4_ =
                 auVar8._20_4_ * 0.6931472 + fVar51 +
                 fVar51 * fVar51 *
                 (((((((((fVar51 * 0.070376836 + -0.1151461) * fVar51 + 0.116769984) * fVar51 +
                       -0.12420141) * fVar51 + 0.14249323) * fVar51 + -0.16668057) * fVar51 +
                    0.20000714) * fVar51 + -0.24999994) * fVar51 + 0.3333333) * fVar51 + -0.5);
            auVar43._24_4_ =
                 auVar8._24_4_ * 0.6931472 + fVar52 +
                 fVar52 * fVar52 *
                 (((((((((fVar52 * 0.070376836 + -0.1151461) * fVar52 + 0.116769984) * fVar52 +
                       -0.12420141) * fVar52 + 0.14249323) * fVar52 + -0.16668057) * fVar52 +
                    0.20000714) * fVar52 + -0.24999994) * fVar52 + 0.3333333) * fVar52 + -0.5);
            auVar43._28_4_ = auVar8._28_4_ + auVar9._28_4_ + -1.0 + auVar7._28_4_ + -0.16666669;
            auVar7 = vorps_avx(auVar37,auVar43);
            local_98 = (float)uVar35;
            fStack_94 = (float)(uVar35 >> 0x20);
            auVar8._4_4_ = auVar7._4_4_ * fStack_94;
            auVar8._0_4_ = auVar7._0_4_ * local_98;
            auVar8._8_4_ = auVar7._8_4_ * -fVar1;
            auVar8._12_4_ = auVar7._12_4_ * -fVar1;
            auVar8._16_4_ = auVar7._16_4_ * local_98;
            auVar8._20_4_ = auVar7._20_4_ * fStack_94;
            auVar8._24_4_ = auVar7._24_4_ * -fVar1;
            auVar8._28_4_ = auVar7._28_4_;
            auVar44._8_4_ = 0x42b0c0a5;
            auVar44._0_8_ = 0x42b0c0a542b0c0a5;
            auVar44._12_4_ = 0x42b0c0a5;
            auVar44._16_4_ = 0x42b0c0a5;
            auVar44._20_4_ = 0x42b0c0a5;
            auVar44._24_4_ = 0x42b0c0a5;
            auVar44._28_4_ = 0x42b0c0a5;
            auVar7 = vminps_avx(auVar8,auVar44);
            auVar37 = vmaxps_avx(auVar61,auVar7);
            auVar45._0_4_ = auVar37._0_4_ * 1.442695 + 0.5;
            auVar45._4_4_ = auVar37._4_4_ * 1.442695 + 0.5;
            auVar45._8_4_ = auVar37._8_4_ * 1.442695 + 0.5;
            auVar45._12_4_ = auVar37._12_4_ * 1.442695 + 0.5;
            auVar45._16_4_ = auVar37._16_4_ * 1.442695 + 0.5;
            auVar45._20_4_ = auVar37._20_4_ * 1.442695 + 0.5;
            auVar45._24_4_ = auVar37._24_4_ * 1.442695 + 0.5;
            auVar45._28_4_ = 0x3ff8aa3b;
            auVar8 = vroundps_avx(auVar45,1);
            auVar7 = vcmpps_avx(auVar45,auVar8,1);
            auVar7 = vandps_avx(auVar7,auVar38);
            auVar7 = vsubps_avx(auVar8,auVar7);
            auVar9._4_4_ = auVar7._4_4_ * 0.6931472;
            auVar9._0_4_ = auVar7._0_4_ * 0.6931472;
            auVar9._8_4_ = auVar7._8_4_ * 0.6931472;
            auVar9._12_4_ = auVar7._12_4_ * 0.6931472;
            auVar9._16_4_ = auVar7._16_4_ * 0.6931472;
            auVar9._20_4_ = auVar7._20_4_ * 0.6931472;
            auVar9._24_4_ = auVar7._24_4_ * 0.6931472;
            auVar9._28_4_ = auVar8._28_4_;
            auVar37 = vsubps_avx(auVar37,auVar9);
            fVar41 = auVar37._0_4_;
            fVar47 = auVar37._4_4_;
            fVar48 = auVar37._8_4_;
            fVar49 = auVar37._12_4_;
            fVar50 = auVar37._16_4_;
            fVar51 = auVar37._20_4_;
            fVar52 = auVar37._24_4_;
            auVar57._0_4_ = (int)auVar7._0_4_;
            auVar57._4_4_ = (int)auVar7._4_4_;
            auVar57._8_4_ = (int)auVar7._8_4_;
            auVar57._12_4_ = (int)auVar7._12_4_;
            auVar46._16_4_ = (int)auVar7._16_4_;
            auVar46._0_16_ = auVar57;
            auVar46._20_4_ = (int)auVar7._20_4_;
            auVar46._24_4_ = (int)auVar7._24_4_;
            auVar46._28_4_ = (int)auVar7._28_4_;
            auVar54 = vpslld_avx(auVar57,0x17);
            auVar57 = vpslld_avx(auVar46._16_16_,0x17);
            auVar57 = vpaddd_avx(auVar59,auVar57);
            auVar54 = vpaddd_avx(auVar59,auVar54);
            auVar11._4_4_ =
                 auVar54._4_4_ * *(float *)(*pauVar28 + 4) *
                 (fVar47 + 1.0 +
                 fVar47 * fVar47 *
                 (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                   0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5));
            auVar11._0_4_ =
                 auVar54._0_4_ * *(float *)*pauVar28 *
                 (fVar41 + 1.0 +
                 fVar41 * fVar41 *
                 (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                   0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5));
            auVar11._8_4_ =
                 auVar54._8_4_ * *(float *)(*pauVar28 + 8) *
                 (fVar48 + 1.0 +
                 fVar48 * fVar48 *
                 (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                   0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5));
            auVar11._12_4_ =
                 auVar54._12_4_ * *(float *)(*pauVar28 + 0xc) *
                 (fVar49 + 1.0 +
                 fVar49 * fVar49 *
                 (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                   0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5));
            auVar11._16_4_ =
                 auVar57._0_4_ * *(float *)(*pauVar28 + 0x10) *
                 (fVar50 + 1.0 +
                 fVar50 * fVar50 *
                 (((((fVar50 * 0.00019875691 + 0.0013981999) * fVar50 + 0.008333452) * fVar50 +
                   0.041665796) * fVar50 + 0.16666666) * fVar50 + 0.5));
            auVar11._20_4_ =
                 auVar57._4_4_ * *(float *)(*pauVar28 + 0x14) *
                 (fVar51 + 1.0 +
                 fVar51 * fVar51 *
                 (((((fVar51 * 0.00019875691 + 0.0013981999) * fVar51 + 0.008333452) * fVar51 +
                   0.041665796) * fVar51 + 0.16666666) * fVar51 + 0.5));
            auVar11._24_4_ =
                 auVar57._8_4_ * *(float *)(*pauVar28 + 0x18) *
                 (fVar52 + 1.0 +
                 fVar52 * fVar52 *
                 (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) * fVar52 +
                   0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5));
            auVar11._28_4_ = auVar37._28_4_ + 1.0 + 0.71826285;
            *pauVar28 = auVar11;
            pfVar22 = pfVar22 + 8;
            pauVar28 = pauVar28 + 1;
            iVar17 = iVar17 + 8;
            uVar16 = uVar25 & 0xfffffff8;
          } while (iVar17 < (int)uVar25);
        }
        local_1e0 = pMVar19;
        if (uVar25 - uVar16 != 0 && (int)uVar16 <= (int)uVar25) {
          lVar32 = 0;
          do {
            fVar36 = powf(fVar58 * pfVar22[lVar32] +
                          *(float *)(&this->field_0xe0 + (long)pp_Var3[-3]),
                          -*(float *)(&this->field_0xdc + (long)pp_Var3[-3]));
            *(float *)(*pauVar28 + lVar32 * 4) = fVar36 * *(float *)(*pauVar28 + lVar32 * 4);
            lVar32 = lVar32 + 1;
          } while (uVar25 - uVar16 != (int)lVar32);
        }
        pMVar19 = (Mat *)((long)&local_1e0->data + 1);
      } while (pMVar19 != pMVar34);
    }
    piVar12 = (int *)CONCAT44(square_sum.refcount._4_4_,(int)square_sum.refcount);
    iVar17 = -100;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        if (square_sum.allocator == (Allocator *)0x0) {
          if (square_sum.data != (void *)0x0) {
            free(square_sum.data);
          }
        }
        else {
          (**(code **)(*(long *)square_sum.allocator + 0x18))();
        }
      }
    }
    if (bVar15) goto LAB_001ec0f3;
  }
  else if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86_avx[-3]) == 1) {
    piVar12 = (int *)CONCAT44(square_blob.refcount._4_4_,(int)square_blob.refcount);
    square_sum.data = square_blob.data;
    square_sum.refcount._0_4_ = (int)square_blob.refcount;
    square_sum.refcount._4_4_ = square_blob.refcount._4_4_;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = (undefined4)(square_blob.elemsize >> 0x20);
    square_sum.elempack = square_blob.elempack;
    square_sum.allocator = square_blob.allocator;
    square_sum.dims = square_blob.dims;
    square_sum.w = square_blob.w;
    square_sum.h = square_blob.h;
    square_sum.d = square_blob.d;
    square_sum.c = square_blob.c;
    square_sum.cstep = square_blob.cstep;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
    }
    uVar25 = uVar16;
    if (1 < (int)*(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3])) {
      uVar25 = *(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3]) >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar30 = ~uVar25 + *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3]);
      copy_make_border(&square_blob,&square_sum,uVar25,iVar30,uVar25,iVar30,0,0.0,
                       (Option *)&_space_ofs);
      uVar25 = square_sum.w;
      if (square_sum.data == (void *)0x0 || (long)square_sum.c * square_sum.cstep == 0) {
        piVar12 = (int *)CONCAT44(square_sum.refcount._4_4_,(int)square_sum.refcount);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (square_sum.allocator == (Allocator *)0x0) {
              if (square_sum.data != (void *)0x0) {
                free(square_sum.data);
              }
            }
            else {
              (**(code **)(*(long *)square_sum.allocator + 0x18))();
            }
          }
        }
        square_sum.cstep = 0;
        square_sum.data = (void *)0x0;
        square_sum.refcount._0_4_ = 0;
        square_sum.refcount._4_4_ = 0;
        square_sum.elemsize._0_4_ = 0;
        square_sum.elemsize._4_4_ = 0;
        square_sum.elempack = 0;
        square_sum.dims = 0;
        square_sum.w = 0;
        square_sum.h = 0;
        square_sum.d = 0;
        square_sum.c = 0;
        goto LAB_001ec0f3;
      }
    }
    iVar17 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3]);
    uVar26 = iVar17 * iVar17;
    fVar58 = *(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_avx[-3]);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar26,&local_1e9);
    piVar14 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pvVar13 = square_sum.data;
    pp_Var3 = this->_vptr_LRN_x86_avx;
    iVar30 = *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]);
    if (0 < iVar30) {
      iVar18 = 0;
      iVar21 = 0;
      iVar27 = 0;
      do {
        if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3])) {
          lVar32 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar27 + lVar32] = iVar21 + (int)lVar32;
            lVar32 = lVar32 + 1;
            iVar31 = (int)lVar32;
          } while (iVar31 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]));
          iVar27 = iVar27 + iVar31;
          iVar21 = iVar21 + iVar31;
        }
        iVar21 = iVar21 + (uVar25 - iVar30);
        iVar18 = iVar18 + 1;
      } while (iVar18 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]));
    }
    if (0 < (int)_c) {
      pvVar4 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->cstep;
      lVar23 = (long)square_sum.w;
      lVar32 = CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize);
      lVar29 = square_sum.cstep * lVar32;
      sVar5 = bottom_top_blob->elemsize;
      local_188 = (Mat *)0x0;
      do {
        if (0 < (int)local_1e8) {
          pvVar33 = (void *)(sVar2 * sVar5 * (long)local_188 + (long)pvVar4);
          pp_Var3 = this->_vptr_LRN_x86_avx;
          local_1e0 = (Mat *)0x0;
          do {
            if (0 < (int)uVar16) {
              lVar24 = lVar23 * lVar32 * (long)local_1e0;
              uVar35 = 0;
              do {
                if (iVar17 == 0) {
                  fVar36 = 0.0;
                }
                else {
                  fVar36 = 0.0;
                  uVar20 = 0;
                  do {
                    fVar36 = fVar36 + *(float *)((long)pvVar13 +
                                                (long)piVar14[uVar20] * 4 +
                                                uVar35 * 4 + lVar24 + lVar29 * (long)local_188);
                    uVar20 = uVar20 + 1;
                  } while (uVar26 + (uVar26 == 0) != uVar20);
                }
                fVar36 = powf(fVar36 * fVar58 * (1.0 / (float)(int)uVar26) +
                              *(float *)(&this->field_0xe0 + (long)pp_Var3[-3]),
                              -*(float *)(&this->field_0xdc + (long)pp_Var3[-3]));
                *(float *)((long)pvVar33 + uVar35 * 4) =
                     fVar36 * *(float *)((long)pvVar33 + uVar35 * 4);
                uVar35 = uVar35 + 1;
              } while (uVar35 != uVar16);
            }
            pvVar33 = (void *)((long)pvVar33 + (long)(int)uVar16 * 4);
            local_1e0 = (Mat *)((long)&local_1e0->data + 1);
          } while (local_1e0 != local_1e8);
        }
        local_188 = (Mat *)((long)&local_188->data + 1);
      } while (local_188 != pMVar34);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar12 = (int *)CONCAT44(square_sum.refcount._4_4_,(int)square_sum.refcount);
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        if (square_sum.allocator == (Allocator *)0x0) {
          if (square_sum.data != (void *)0x0) {
            free(square_sum.data);
          }
        }
        else {
          (**(code **)(*(long *)square_sum.allocator + 0x18))();
        }
      }
    }
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
  }
  iVar17 = 0;
LAB_001ec0f3:
  piVar12 = (int *)CONCAT44(square_blob.refcount._4_4_,(int)square_blob.refcount);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (square_blob.allocator == (Allocator *)0x0) {
        if (square_blob.data != (void *)0x0) {
          free(square_blob.data);
        }
      }
      else {
        (**(code **)(*(long *)square_blob.allocator + 0x18))();
      }
    }
  }
  return iVar17;
}

Assistant:

int LRN_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}